

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_float64_primitive_asIEEEFloat64Decoded
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  double value;
  sysbvm_tuple_t sVar2;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    value = (double)((long)uVar1 >> 4);
  }
  else {
    value = *(double *)(uVar1 + 0x10);
  }
  sVar2 = sysbvm_tuple_float64_encode(context,value);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_asIEEEFloat64Decoded(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    uint64_t uint64Value = sysbvm_tuple_uint64_decode(arguments[0]);
    double floatValue = 0;
    memcpy(&floatValue, &uint64Value, 8);

    return sysbvm_tuple_float64_encode(context, floatValue);
}